

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void __thiscall BinNE<0,_4,_0>::BinNE(BinNE<0,_4,_0> *this,IntView<0> _x,IntView<4> _y,BoolView *_r)

{
  IntVar *pIVar1;
  BinNE<0,_4,_0> *local_38;
  
  pIVar1 = _x.var;
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020fe18;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  local_38 = (BinNE<0,_4,_0> *)&this->super_Checker;
  (this->super_Checker)._vptr_Checker = (_func_int **)&PTR___cxa_pure_virtual_002102d0;
  vec<Checker_*>::push(&engine.checkers,(Checker **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BinNE_00213648;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_002136b0;
  (this->x).var = pIVar1;
  (this->x).a = (int)_x._8_8_;
  (this->x).b = (int)((ulong)_x._8_8_ >> 0x20);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020fb28;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,0,8);
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,1,8);
  return;
}

Assistant:

BinNE(IntView<U> _x, IntView<V> _y, BoolView _r = bv_true) : x(_x), y(_y), r(std::move(_r)) {
		x.attach(this, 0, EVENT_F);
		y.attach(this, 1, EVENT_F);
		if (R != 0) {
			r.attach(this, 2, EVENT_L);
		}
		//		printf("BinNE: %d %d %d\n", U, V, R);
	}